

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this,path *name,
          dimension2d<unsigned_int> *size,E_TEXTURE_TYPE type,ECOLOR_FORMAT format,
          COpenGL3DriverBase *driver)

{
  int iVar1;
  bool bVar2;
  undefined4 uVar3;
  GLenum GVar4;
  ECOLOR_FORMAT EVar5;
  u32 uVar6;
  ulong uVar7;
  COpenGL3CacheHandler *pCVar8;
  STextureCache *this_00;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  double __x;
  double __x_00;
  char msg [256];
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *prevTexture;
  undefined4 in_stack_fffffffffffffe88;
  E_TEXTURE_TYPE in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  void **in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  GLint GVar9;
  undefined8 in_stack_fffffffffffffea8;
  OpenGLProcedures *pOVar10;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Printer local_138 [68];
  ESetTextureActive in_stack_ffffffffffffff0c;
  ITexture *in_stack_ffffffffffffff10;
  u32 in_stack_ffffffffffffff1c;
  STextureCache *in_stack_ffffffffffffff20;
  
  EVar5 = (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x1e));
  ITexture::ITexture((ITexture *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe98,
                     (path *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe8c);
  *in_RDI = 0x43f048;
  in_RDI[0x1e] = 0x43f088;
  in_RDI[0xf] = in_R9;
  *(undefined4 *)(in_RDI + 0x10) = 0xde1;
  *(undefined4 *)((long)in_RDI + 0x84) = 0;
  *(undefined4 *)(in_RDI + 0x11) = 0x1908;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0x1908;
  *(undefined4 *)(in_RDI + 0x12) = 0x1401;
  in_RDI[0x13] = 0;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  in_RDI[0x15] = 0;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(undefined1 *)((long)in_RDI + 0xb4) = 0;
  core::array<irr::video::IImage_*>::array
            ((array<irr::video::IImage_*> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  *(undefined1 *)(in_RDI + 0x1b) = 0;
  *(undefined1 *)((long)in_RDI + 0xd9) = 0;
  SStatesCache::SStatesCache((SStatesCache *)((long)in_RDI + 0xdc));
  uVar3 = (**(code **)(*(long *)in_RDI[0xf] + 0x2a0))();
  *(undefined4 *)(in_RDI + 0xb) = uVar3;
  GVar4 = TextureTypeIrrToGL((COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),ETT_2D);
  *(GLenum *)(in_RDI + 0x10) = GVar4;
  *(undefined1 *)(in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0x69) = 1;
  *(undefined4 *)((long)in_RDI + 0x5c) = in_R8D;
  if (*(int *)((long)in_RDI + 0x5c) == 0x11) {
    (**(code **)(*(long *)in_RDI[0xf] + 0x1d0))();
    EVar5 = getBestColorFormat((COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),EVar5);
    *(ECOLOR_FORMAT *)(in_RDI + 0xc) = EVar5;
  }
  else {
    *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)((long)in_RDI + 0x5c);
  }
  in_RDI[9] = *in_RDX;
  in_RDI[10] = in_RDI[9];
  iVar1 = *(int *)(in_RDI + 10);
  uVar6 = IImage::getBitsPerPixelFromFormat(*(ECOLOR_FORMAT *)(in_RDI + 0xc));
  *(u32 *)((long)in_RDI + 100) = iVar1 * uVar6 >> 3;
  uVar7 = (**(code **)(*(long *)in_RDI[0xf] + 0x410))
                    ((long *)in_RDI[0xf],*(undefined4 *)(in_RDI + 0xc),in_RDI + 0x11,
                     (long)in_RDI + 0x8c,in_RDI + 0x12);
  if ((uVar7 & 1) == 0) {
    os::Printer::log(__x);
  }
  else {
    pOVar10 = &GL;
    (*GL.GenTextures)(1,(GLuint *)((long)in_RDI + 0x84));
    pCVar8 = COpenGL3DriverBase::getCacheHandler((COpenGL3DriverBase *)in_RDI[0xf]);
    this_00 = COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
              ::getTextureCache(pCVar8);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::get(this_00,0);
    pCVar8 = COpenGL3DriverBase::getCacheHandler((COpenGL3DriverBase *)in_RDI[0xf]);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::getTextureCache(pCVar8);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    GVar9 = 0x2600;
    (*pOVar10->TexParameteri)(*(GLenum *)(in_RDI + 0x10),0x2801,0x2600);
    (*pOVar10->TexParameteri)(*(GLenum *)(in_RDI + 0x10),0x2800,GVar9);
    GVar9 = 0x812f;
    (*pOVar10->TexParameteri)(*(GLenum *)(in_RDI + 0x10),0x2802,0x812f);
    (*pOVar10->TexParameteri)(*(GLenum *)(in_RDI + 0x10),0x2803,GVar9);
    (*pOVar10->TexParameteri)(*(GLenum *)(in_RDI + 0x10),0x8072,GVar9);
    *(undefined1 *)((long)in_RDI + 0xdc) = 2;
    *(undefined1 *)((long)in_RDI + 0xdd) = 2;
    *(undefined1 *)((long)in_RDI + 0xde) = 2;
    if (*(int *)(in_RDI + 0xe) == 0) {
      (*GL.TexImage2D)(0xde1,0,*(GLint *)(in_RDI + 0x11),*(GLsizei *)(in_RDI + 10),
                       *(GLsizei *)((long)in_RDI + 0x54),0,*(GLenum *)((long)in_RDI + 0x8c),
                       *(GLenum *)(in_RDI + 0x12),(void *)0x0);
    }
    else if (*(int *)(in_RDI + 0xe) == 1) {
      (*GL.TexImage2D)(0x8515,0,*(GLint *)(in_RDI + 0x11),*(GLsizei *)(in_RDI + 10),
                       *(GLsizei *)((long)in_RDI + 0x54),0,*(GLenum *)((long)in_RDI + 0x8c),
                       *(GLenum *)(in_RDI + 0x12),(void *)0x0);
      (*GL.TexImage2D)(0x8516,0,*(GLint *)(in_RDI + 0x11),*(GLsizei *)(in_RDI + 10),
                       *(GLsizei *)((long)in_RDI + 0x54),0,*(GLenum *)((long)in_RDI + 0x8c),
                       *(GLenum *)(in_RDI + 0x12),(void *)0x0);
      (*GL.TexImage2D)(0x8517,0,*(GLint *)(in_RDI + 0x11),*(GLsizei *)(in_RDI + 10),
                       *(GLsizei *)((long)in_RDI + 0x54),0,*(GLenum *)((long)in_RDI + 0x8c),
                       *(GLenum *)(in_RDI + 0x12),(void *)0x0);
      (*GL.TexImage2D)(0x8518,0,*(GLint *)(in_RDI + 0x11),*(GLsizei *)(in_RDI + 10),
                       *(GLsizei *)((long)in_RDI + 0x54),0,*(GLenum *)((long)in_RDI + 0x8c),
                       *(GLenum *)(in_RDI + 0x12),(void *)0x0);
      (*GL.TexImage2D)(0x8519,0,*(GLint *)(in_RDI + 0x11),*(GLsizei *)(in_RDI + 10),
                       *(GLsizei *)((long)in_RDI + 0x54),0,*(GLenum *)((long)in_RDI + 0x8c),
                       *(GLenum *)(in_RDI + 0x12),(void *)0x0);
      (*GL.TexImage2D)(0x851a,0,*(GLint *)(in_RDI + 0x11),*(GLsizei *)(in_RDI + 10),
                       *(GLsizei *)((long)in_RDI + 0x54),0,*(GLenum *)((long)in_RDI + 0x8c),
                       *(GLenum *)(in_RDI + 0x12),(void *)0x0);
    }
    pCVar8 = COpenGL3DriverBase::getCacheHandler((COpenGL3DriverBase *)in_RDI[0xf]);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::getTextureCache(pCVar8);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    bVar2 = COpenGL3DriverBase::testGLError((COpenGL3DriverBase *)in_RDI[0xf],0xbf);
    if (bVar2) {
      snprintf((char *)local_138,0x100,
               "COpenGLCoreTexture: InternalFormat:0x%04x PixelFormat:0x%04x",
               (ulong)*(uint *)(in_RDI + 0x11),(ulong)*(uint *)((long)in_RDI + 0x8c));
      os::Printer::log(local_138,__x_00);
    }
  }
  return;
}

Assistant:

COpenGLCoreTexture(const io::path &name, const core::dimension2d<u32> &size, E_TEXTURE_TYPE type, ECOLOR_FORMAT format, TOpenGLDriver *driver) :
			ITexture(name, type),
			Driver(driver), TextureType(GL_TEXTURE_2D),
			TextureName(0), InternalFormat(GL_RGBA), PixelFormat(GL_RGBA), PixelType(GL_UNSIGNED_BYTE), Converter(0), LockReadOnly(false), LockImage(0), LockLayer(0), KeepImage(false),
			MipLevelStored(0), LegacyAutoGenerateMipMaps(false)
	{
		DriverType = Driver->getDriverType();
		TextureType = TextureTypeIrrToGL(Type);
		HasMipMaps = false;
		IsRenderTarget = true;

		OriginalColorFormat = format;

		if (ECF_UNKNOWN == OriginalColorFormat)
			ColorFormat = getBestColorFormat(Driver->getColorFormat());
		else
			ColorFormat = OriginalColorFormat;

		OriginalSize = size;
		Size = OriginalSize;

		Pitch = Size.Width * IImage::getBitsPerPixelFromFormat(ColorFormat) / 8;

		if (!Driver->getColorFormatParameters(ColorFormat, InternalFormat, PixelFormat, PixelType, &Converter)) {
			os::Printer::log("COpenGLCoreTexture: Color format is not supported", ColorFormatNames[ColorFormat < ECF_UNKNOWN ? ColorFormat : ECF_UNKNOWN], ELL_ERROR);
			return;
		}

		GL.GenTextures(1, &TextureName);

		const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
		Driver->getCacheHandler()->getTextureCache().set(0, this);

		GL.TexParameteri(TextureType, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

#if defined(GL_VERSION_1_2)
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
#endif

		StatesCache.WrapU = ETC_CLAMP_TO_EDGE;
		StatesCache.WrapV = ETC_CLAMP_TO_EDGE;
		StatesCache.WrapW = ETC_CLAMP_TO_EDGE;

		switch (Type) {
		case ETT_2D:
			GL.TexImage2D(GL_TEXTURE_2D, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			break;
		case ETT_CUBEMAP:
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			break;
		}

		Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);
		if (Driver->testGLError(__LINE__)) {
			char msg[256];
			snprintf_irr(msg, 256, "COpenGLCoreTexture: InternalFormat:0x%04x PixelFormat:0x%04x", (int)InternalFormat, (int)PixelFormat);
			os::Printer::log(msg, ELL_ERROR);
		}
	}